

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabios.c
# Opt level: O0

void load_alternate_bios(char *filename)

{
  FILE *__stream;
  size_t __size;
  uint8_t *__ptr;
  char *in_RDI;
  uint8_t *buf;
  size_t size;
  FILE *fp;
  
  __stream = fopen(in_RDI,"rb");
  fseek(__stream,0,2);
  __size = ftell(__stream);
  fseek(__stream,0,0);
  __ptr = (uint8_t *)malloc(__size);
  fread(__ptr,__size,1,__stream);
  if (__size != 0x4000) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabios.c",
            0x263);
    fprintf(_stderr,"Incorrect bios size! Got: %zu expected: %d\n\x1b[0;m",__size,0x4000);
    exit(1);
  }
  alternate_bios = __ptr;
  return;
}

Assistant:

void load_alternate_bios(const char* filename) {
    FILE *fp = fopen(filename, "rb");

    fseek(fp, 0, SEEK_END);
    size_t size = ftell(fp);
    fseek(fp, 0, SEEK_SET);
    byte *buf = malloc(size);
    fread(buf, size, 1, fp);

    if (size != GBA_BIOS_SIZE) {
        logfatal("Incorrect bios size! Got: %zu expected: %d", size, GBA_BIOS_SIZE)
    }

    alternate_bios = buf;
}